

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O2

socket_handle __thiscall
FIX::SocketServer::add
          (SocketServer *this,int port,bool reuse,bool noDelay,int sendBufSize,int rcvBufSize)

{
  PortToInfo *this_00;
  short sVar1;
  socket_handle s;
  iterator iVar2;
  mapped_type *pmVar3;
  SocketException *this_01;
  undefined7 in_register_00000009;
  bool bVar4;
  int port_local;
  socket_handle socket;
  undefined4 local_34;
  
  this_00 = &this->m_portToInfo;
  port_local = port;
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
          ::find(&this_00->_M_t,&port_local);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_portToInfo)._M_t._M_impl.super__Rb_tree_header)
  {
    s = socket_createAcceptor(port_local,reuse);
    socket = s;
    if (s == -1) {
      this_01 = (SocketException *)__cxa_allocate_exception(0x50);
      SocketException::SocketException(this_01);
      __cxa_throw(this_01,&SocketException::typeinfo,Exception::~Exception);
    }
    if (noDelay) {
      socket_setsockopt(s,1);
    }
    if (sendBufSize != 0) {
      socket_setsockopt(s,7,sendBufSize);
    }
    local_34 = (undefined4)CONCAT71(in_register_00000009,noDelay);
    if (rcvBufSize != 0) {
      socket_setsockopt(s,8,rcvBufSize);
    }
    SocketMonitor::addRead(&this->m_monitor,s);
    sVar1 = (short)port_local;
    pmVar3 = std::
             map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
             ::operator[](&this->m_socketToInfo,&socket);
    pmVar3->m_socket = s;
    pmVar3->m_port = sVar1;
    bVar4 = SUB41(local_34,0);
    pmVar3->m_noDelay = bVar4;
    pmVar3->m_sendBufSize = sendBufSize;
    pmVar3->m_rcvBufSize = rcvBufSize;
    pmVar3 = std::
             map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
             ::operator[](this_00,&port_local);
    pmVar3->m_socket = s;
    pmVar3->m_port = sVar1;
    pmVar3->m_noDelay = bVar4;
    pmVar3->m_sendBufSize = sendBufSize;
    pmVar3->m_rcvBufSize = rcvBufSize;
    pmVar3 = (mapped_type *)&socket;
  }
  else {
    pmVar3 = std::
             map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
             ::operator[](this_00,&port_local);
  }
  return pmVar3->m_socket;
}

Assistant:

socket_handle SocketServer::add( int port, bool reuse, bool noDelay,
                       int sendBufSize, int rcvBufSize )
  EXCEPT ( SocketException& )
{
  if( m_portToInfo.find(port) != m_portToInfo.end() )
    return m_portToInfo[port].m_socket;

  socket_handle socket = socket_createAcceptor( port, reuse );
  if( socket == INVALID_SOCKET_HANDLE)
    throw SocketException();
  if( noDelay )
    socket_setsockopt( socket, TCP_NODELAY );
  if( sendBufSize )
    socket_setsockopt( socket, SO_SNDBUF, sendBufSize );
  if( rcvBufSize )
    socket_setsockopt( socket, SO_RCVBUF, rcvBufSize );
  m_monitor.addRead( socket );

  SocketInfo info( socket, port, noDelay, sendBufSize, rcvBufSize );
  m_socketToInfo[socket] = info;
  m_portToInfo[port] = info;
  return socket;
}